

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O2

thread_priority oqpi::posix_thread::get_priority(native_handle_type handle)

{
  FILE *__stream;
  sched_param sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  thread_priority tVar5;
  pthread_t pVar6;
  sched_param posixPriority;
  int policy;
  
  posixPriority.sched_priority = 0;
  policy = 2;
  iVar2 = pthread_getschedparam(handle,&policy,(sched_param *)&posixPriority);
  sVar1 = posixPriority;
  __stream = _stderr;
  if (iVar2 == 0) {
    iVar2 = get_min_priority();
    iVar3 = get_max_priority();
    iVar4 = get_min_priority();
    tVar5 = (thread_priority)
            (((float)(sVar1.sched_priority - iVar2) / (float)(iVar3 - iVar4)) * 5.0);
  }
  else {
    pVar6 = pthread_self();
    fprintf(__stream,"[warning] Unable to retrieve thread priority for thread %lu\n",pVar6);
    tVar5 = normal;
  }
  return tVar5;
}

Assistant:

static thread_priority get_priority(native_handle_type handle)
        {
            auto threadPriority = thread_priority::normal;
            auto posixPriority  = sched_param{};
            auto policy         = POSIX_SCHED_POLICY;
            const auto error    = pthread_getschedparam(handle, &policy, &posixPriority);

            if(error == 0)
            {
                const auto prioFrac = (posixPriority.sched_priority - get_min_priority()) / (float)(get_max_priority() - get_min_priority());
                threadPriority      = static_cast<thread_priority>(prioFrac * ((uint32_t) thread_priority::count - 1));
            }
            else
            {
                oqpi_warning("Unable to retrieve thread priority for thread %lu", get_current_thread_id());
            }

            return threadPriority;
        }